

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# varint.hpp
# Opt level: O3

uint64_t pstore::varint::decode<unsigned_char*>(uchar *in,uint size)

{
  byte bVar1;
  uint uVar2;
  ulong uVar3;
  sbyte sVar4;
  byte bVar5;
  ulong uVar6;
  byte *pbVar7;
  
  if ((size == 0) || (uVar2 = bit_count::ctz((ulong)*in | 0x100), uVar2 + 1 != size)) {
    assert_failed("size > 0 && size == decode_size (in)",
                  "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/support/varint.hpp"
                  ,0x86);
  }
  uVar3 = 0;
  switch(size) {
  case 2:
    bVar5 = 0;
    goto LAB_001191f7;
  case 3:
    bVar5 = 0;
    goto LAB_001191e8;
  case 4:
    bVar5 = 0;
    goto LAB_001191d9;
  case 5:
    sVar4 = 0;
    goto LAB_001191ca;
  case 6:
    sVar4 = 0;
    goto LAB_001191bb;
  case 7:
    sVar4 = 0;
    break;
  case 8:
    uVar3 = (ulong)*in;
    in = in + 1;
    sVar4 = 8;
    break;
  case 9:
    pbVar7 = in + 1;
    uVar6 = 0xfffffffffffffff8;
    uVar3 = 0;
    do {
      uVar6 = uVar6 + 8;
      uVar3 = uVar3 | (ulong)*pbVar7 << ((byte)uVar6 & 0x3f);
      pbVar7 = pbVar7 + 1;
    } while (uVar6 < 0x38);
    return uVar3;
  default:
    bVar5 = 0;
    goto LAB_00119206;
  }
  bVar5 = *in;
  in = in + 1;
  uVar3 = uVar3 | (ulong)bVar5 << sVar4;
  sVar4 = sVar4 + 8;
LAB_001191bb:
  bVar5 = *in;
  in = in + 1;
  uVar3 = uVar3 | (ulong)bVar5 << sVar4;
  sVar4 = sVar4 + 8;
LAB_001191ca:
  bVar5 = *in;
  in = in + 1;
  uVar3 = uVar3 | (ulong)bVar5 << sVar4;
  bVar5 = sVar4 + 8;
LAB_001191d9:
  bVar1 = *in;
  in = in + 1;
  uVar3 = uVar3 | (ulong)bVar1 << (bVar5 & 0x3f);
  bVar5 = bVar5 + 8;
LAB_001191e8:
  bVar1 = *in;
  in = in + 1;
  uVar3 = uVar3 | (ulong)bVar1 << (bVar5 & 0x3f);
  bVar5 = bVar5 + 8;
LAB_001191f7:
  bVar1 = *in;
  in = in + 1;
  uVar3 = uVar3 | (ulong)bVar1 << (bVar5 & 0x3f);
  bVar5 = bVar5 + 8;
LAB_00119206:
  return ((ulong)*in << (bVar5 & 0x3f) | uVar3) >> ((byte)size & 0x3f);
}

Assistant:

std::uint64_t decode (InputIterator in, unsigned size) {
            PSTORE_ASSERT (size > 0 && size == decode_size (in));
            if (size == 9) {
                return details::decode9 (in);
            }

            auto result = std::uint64_t{0};
            auto shift = 0U;
            // clang-format off
            switch (size) {
            // NOLINTNEXTLINE(bugprone-branch-clone)
            case 8: result |= std::uint64_t{*(in++)} << shift; shift += 8; PSTORE_FALLTHROUGH;
            case 7: result |= std::uint64_t{*(in++)} << shift; shift += 8; PSTORE_FALLTHROUGH;
            case 6: result |= std::uint64_t{*(in++)} << shift; shift += 8; PSTORE_FALLTHROUGH;
            case 5: result |= std::uint64_t{*(in++)} << shift; shift += 8; PSTORE_FALLTHROUGH;
            case 4: result |= std::uint64_t{*(in++)} << shift; shift += 8; PSTORE_FALLTHROUGH;
            case 3: result |= std::uint64_t{*(in++)} << shift; shift += 8; PSTORE_FALLTHROUGH;
            case 2: result |= std::uint64_t{*(in++)} << shift; shift += 8; PSTORE_FALLTHROUGH;
            default:
                result |= std::uint64_t{*(in++)} << shift;
            }
            // clang-format on
            return result >> size; // throw away the unwanted size bytes frm the first byte.
        }